

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
duckdb_fmt::v6::internal::
arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>::
operator()(arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>
           *this,basic_string_view<wchar_t> value)

{
  ulong uVar1;
  uint uVar2;
  buffer<wchar_t> *pbVar3;
  size_t sVar4;
  ulong uVar5;
  wchar_t *data;
  str_writer<wchar_t> local_40;
  
  uVar5 = value.size_;
  if (this->specs_ == (format_specs *)0x0) {
    pbVar3 = (this->writer_).out_.container;
    sVar4 = pbVar3->size_;
    uVar1 = sVar4 + uVar5;
    if (pbVar3->capacity_ < uVar1) {
      (**pbVar3->_vptr_buffer)(pbVar3,uVar1);
    }
    pbVar3->size_ = uVar1;
    if (uVar5 != 0) {
      memmove(pbVar3->ptr_ + sVar4,value.data_,uVar5 << 2);
    }
  }
  else {
    check_string_type_spec<char,duckdb_fmt::v6::internal::error_handler>
              (this->specs_->type,(error_handler *)&local_40);
    uVar2 = this->specs_->precision;
    local_40.size_ = (ulong)uVar2;
    if (uVar5 <= uVar2) {
      local_40.size_ = uVar5;
    }
    if ((int)uVar2 < 0) {
      local_40.size_ = uVar5;
    }
    local_40.s = value.data_;
    basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
    write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::str_writer<wchar_t>>
              ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this,this->specs_,&local_40);
  }
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }